

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupOutOfMemoryTestsForOperatorNew::
TEST_GROUP_CppUTestGroupOutOfMemoryTestsForOperatorNew
          (TEST_GROUP_CppUTestGroupOutOfMemoryTestsForOperatorNew *this)

{
  TEST_GROUP_CppUTestGroupOutOfMemoryTestsForOperatorNew *this_local;
  
  Utest::Utest(&this->super_Utest);
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupOutOfMemoryTestsForOperatorNew_00403eb8;
  GlobalMemoryAllocatorStash::GlobalMemoryAllocatorStash(&this->memoryAllocatorStash);
  return;
}

Assistant:

TEST_GROUP(OutOfMemoryTestsForOperatorNew)
{
    TestMemoryAllocator* no_memory_allocator;
    GlobalMemoryAllocatorStash memoryAllocatorStash;
    void setup() _override
    {
        memoryAllocatorStash.save();
        no_memory_allocator = new NullUnknownAllocator;
        setCurrentNewAllocator(no_memory_allocator);
        setCurrentNewArrayAllocator(no_memory_allocator);
    }

    void teardown() _override
    {
        memoryAllocatorStash.restore();
        delete no_memory_allocator;
    }
}